

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ImGuiDataType v_00;
  ImGuiKey IVar8;
  undefined1 is_logarithmic;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float logarithmic_zero_epsilon;
  
  pIVar2 = GImGui;
  uVar11 = flags & 0x100000;
  uVar9 = data_type & 0xfffffffe;
  uVar5 = v_min - v_max;
  uVar10 = -uVar5;
  if (0 < (int)uVar5) {
    uVar10 = uVar5;
  }
  fVar21 = *(float *)((long)&(bb->Min).x + (ulong)(uVar11 >> 0x12));
  fVar19 = *(float *)((long)&(bb->Max).x + (ulong)(uVar11 >> 0x12));
  fVar17 = (fVar19 - fVar21) + -4.0;
  fVar20 = (GImGui->Style).GrabMinSize;
  if (uVar9 != 8) {
    fVar15 = fVar17 / (float)(int)(uVar10 + 1);
    uVar5 = -(uint)(fVar20 <= fVar15);
    fVar20 = (float)(~uVar5 & (uint)fVar20 | (uint)fVar15 & uVar5);
  }
  if (fVar17 <= fVar20) {
    fVar20 = fVar17;
  }
  fVar16 = fVar17 - fVar20;
  fVar12 = -fVar20;
  fVar15 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  iVar7 = v_max;
  if ((flags & 0x20U) != 0) {
    if (uVar9 == 8) {
      iVar6 = ImParseFormatPrecision(format,3);
      fVar15 = (float)iVar6;
    }
    else {
      fVar15 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar15);
    fVar15 = fVar16;
    if (fVar16 <= 1.0) {
      fVar15 = 1.0;
    }
    fVar15 = ((pIVar2->Style).LogSliderDeadzone * 0.5) / fVar15;
  }
  is_logarithmic = (undefined1)iVar7;
  fVar21 = fVar21 + 2.0 + fVar20 * 0.5;
  fVar19 = (fVar19 + -2.0) - fVar20 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar2->ActiveIdIsJustActivated == true) {
        pIVar2->SliderCurrentAccum = 0.0;
        pIVar2->SliderCurrentAccumDirty = false;
      }
      if (uVar11 == 0) {
        fVar16 = GetNavTweakPressedAmount(ImGuiAxis_X);
      }
      else {
        fVar16 = GetNavTweakPressedAmount(ImGuiAxis_Y);
        fVar16 = -fVar16;
      }
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        IVar8 = ImGuiKey_ModCtrl;
        if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
          IVar8 = ImGuiKey_GamepadL1;
        }
        bVar3 = IsKeyDown(IVar8);
        IVar8 = ImGuiKey_ModShift;
        if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
          IVar8 = ImGuiKey_GamepadR1;
        }
        bVar4 = IsKeyDown(IVar8);
        if ((uVar9 == 8) && (iVar7 = ImParseFormatPrecision(format,3), 0 < iVar7)) {
          fVar16 = fVar16 / 100.0;
          if (bVar3) {
            fVar16 = fVar16 / 10.0;
          }
        }
        else if (uVar10 < 0x65 || bVar3) {
          fVar16 = *(float *)(&DAT_0022c958 + (ulong)(fVar16 < 0.0) * 4) / (float)(int)uVar10;
        }
        else {
          fVar16 = fVar16 / 100.0;
        }
        if (bVar4) {
          fVar16 = fVar16 * 10.0;
        }
        fVar16 = fVar16 + pIVar2->SliderCurrentAccum;
        pIVar2->SliderCurrentAccum = fVar16;
        pIVar2->SliderCurrentAccumDirty = true;
      }
      else {
        fVar16 = pIVar2->SliderCurrentAccum;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar2->SliderCurrentAccumDirty == true) {
        uVar10 = (flags & 0x20U) >> 5;
        fVar14 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,uVar10,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,fVar15);
        if (((1.0 <= fVar14) && (0.0 < fVar16)) || ((fVar14 <= 0.0 && (fVar16 < 0.0)))) {
          pIVar2->SliderCurrentAccum = 0.0;
          pIVar2->SliderCurrentAccumDirty = false;
          bVar3 = false;
          goto LAB_001ffb76;
        }
        fVar18 = fVar16 + fVar14;
        fVar13 = 1.0;
        if (fVar18 <= 1.0) {
          fVar13 = fVar18;
        }
        fVar13 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar13);
        v_00 = ScaleValueFromRatioT<int,int,float>
                         (data_type,fVar13,v_min,v_max,SUB41(uVar10,0),logarithmic_zero_epsilon,
                          fVar15);
        if (uVar9 == 8 && (flags & 0x40U) == 0) {
          v_00 = RoundScalarWithFormatT<int>(format,data_type,v_00);
        }
        fVar18 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,v_00,v_min,v_max,uVar10,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,fVar15);
        fVar18 = fVar18 - fVar14;
        bVar3 = fVar16 <= fVar18;
        if (0.0 < fVar16) {
          bVar3 = fVar18 < fVar16;
        }
        if (!bVar3) {
          fVar18 = fVar16;
        }
        pIVar2->SliderCurrentAccum = pIVar2->SliderCurrentAccum - fVar18;
        pIVar2->SliderCurrentAccumDirty = false;
        goto LAB_001ffa7f;
      }
      bVar3 = false;
      goto LAB_001ffb76;
    }
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        fVar14 = (pIVar2->IO).NavInputs[(ulong)(uVar11 >> 0x14) + 0x10];
        if (pIVar2->ActiveIdIsJustActivated == true) {
          fVar13 = ScaleRatioFromValueT<int,int,float>
                             ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,(flags & 0x20U) >> 5,
                              (bool)is_logarithmic,logarithmic_zero_epsilon,fVar15);
          if (uVar11 != 0) {
            fVar13 = 1.0 - fVar13;
          }
          fVar13 = (fVar19 - fVar21) * fVar13 + fVar21;
          fVar18 = 0.0;
          if (fVar14 <= fVar20 * 0.5 + fVar13 + 1.0 && fVar12 * 0.5 + fVar13 + -1.0 <= fVar14) {
            fVar18 = fVar14 - fVar13;
          }
          fVar13 = 0.0;
          if (uVar9 == 8) {
            fVar13 = fVar18;
          }
          pIVar2->SliderGrabClickOffset = fVar13;
        }
        fVar13 = 0.0;
        if (0.0 < fVar16) {
          fVar16 = ((fVar14 - pIVar2->SliderGrabClickOffset) - fVar21) / fVar16;
          fVar13 = 1.0;
          if (fVar16 <= 1.0) {
            fVar13 = fVar16;
          }
          fVar13 = (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar13);
        }
        if (uVar11 != 0) {
          fVar13 = 1.0 - fVar13;
        }
LAB_001ffa7f:
        iVar7 = ScaleValueFromRatioT<int,int,float>
                          (data_type,fVar13,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),
                           logarithmic_zero_epsilon,fVar15);
        if (uVar9 == 8 && (flags & 0x40U) == 0) {
          iVar7 = RoundScalarWithFormatT<int>(format,data_type,iVar7);
        }
        if (*v == iVar7) {
          bVar3 = false;
        }
        else {
          *v = iVar7;
          bVar3 = true;
        }
        goto LAB_001ffb76;
      }
      ClearActiveID();
    }
  }
  bVar3 = false;
LAB_001ffb76:
  if (1.0 <= fVar17) {
    fVar17 = ScaleRatioFromValueT<int,int,float>
                       ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,(flags & 0x20U) >> 5,
                        (bool)is_logarithmic,logarithmic_zero_epsilon,fVar15);
    if (uVar11 != 0) {
      fVar17 = 1.0 - fVar17;
    }
    fVar21 = (fVar19 - fVar21) * fVar17 + fVar21;
    if (uVar11 != 0) {
      fVar19 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = fVar12 * 0.5 + fVar21;
      (out_grab_bb->Max).x = fVar19 + -2.0;
      (out_grab_bb->Max).y = fVar20 * 0.5 + fVar21;
    }
    else {
      fVar19 = (bb->Min).y;
      fVar17 = (bb->Max).y;
      (out_grab_bb->Min).x = fVar12 * 0.5 + fVar21;
      (out_grab_bb->Min).y = fVar19 + 2.0;
      (out_grab_bb->Max).x = fVar20 * 0.5 + fVar21;
      (out_grab_bb->Max).y = fVar17 + -2.0;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar3;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}